

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void lj_state_shrinkstack(lua_State *L,MSize used)

{
  int in_ESI;
  ulong in_RDI;
  MSize in_stack_0000001c;
  lua_State *in_stack_00000020;
  
  if ((((*(uint *)(in_RDI + 0x38) < 0xffe3) && ((uint)(in_ESI << 2) < *(uint *)(in_RDI + 0x38))) &&
      (0x5a < *(uint *)(in_RDI + 0x38))) &&
     ((*(int *)((ulong)*(uint *)(in_RDI + 8) + 400) == 0 ||
      (in_RDI != *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x188))))) {
    resizestack(in_stack_00000020,in_stack_0000001c);
  }
  return;
}

Assistant:

void lj_state_shrinkstack(lua_State *L, MSize used)
{
  if (L->stacksize > LJ_STACK_MAXEX)
    return;  /* Avoid stack shrinking while handling stack overflow. */
  if (4*used < L->stacksize &&
      2*(LJ_STACK_START+LJ_STACK_EXTRA) < L->stacksize &&
      /* Don't shrink stack of live trace. */
      (tvref(G(L)->jit_base) == NULL || obj2gco(L) != gcref(G(L)->cur_L)))
    resizestack(L, L->stacksize >> 1);
}